

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest_BasicPlugin_Test>
::CreateTest(TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CommandLineInterfaceTest_BasicPlugin_Test>
             *this)

{
  CommandLineInterfaceTester *this_00;
  
  this_00 = (CommandLineInterfaceTester *)operator_new(0x2e8);
  google::protobuf::compiler::CommandLineInterfaceTester::CommandLineInterfaceTester(this_00);
  this_00[1].super_Test._vptr_Test = (_func_int **)0x0;
  *(undefined1 *)
   &this_00[1].super_Test.gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  this_00[1].cli_.executable_name_._M_dataplus._M_p = (pointer)0x0;
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__CommandLineInterfaceTester_018c7b48;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }